

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib1556.c
# Opt level: O0

size_t header(void *ptr,size_t size,size_t nmemb,void *stream)

{
  headerinfo *info;
  size_t headersize;
  void *stream_local;
  size_t nmemb_local;
  size_t size_local;
  void *ptr_local;
  
  if (*stream < size * nmemb) {
    *(size_t *)stream = size * nmemb;
  }
  return nmemb * size;
}

Assistant:

static size_t header(void *ptr, size_t size, size_t nmemb, void *stream)
{
  size_t headersize = size * nmemb;
  struct headerinfo *info = (struct headerinfo *)stream;
  (void)ptr;

  if(headersize > info->largest)
    /* remember the longest header */
    info->largest = headersize;

  return nmemb * size;
}